

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Iterator<float,true,std::allocator<unsigned_long>>::
coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Iterator<float,true,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          it)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  size_t j;
  long lVar4;
  
  marray_detail::Assert<bool>(*(long *)this != 0);
  marray_detail::Assert<bool>(*(ulong *)(this + 0x10) < *(ulong *)(*(long *)this + 0x30));
  bVar3 = View<float,_true,_std::allocator<unsigned_long>_>::isSimple
                    (*(View<float,_true,_std::allocator<unsigned_long>_> **)this);
  if (bVar3) {
    View<float,true,std::allocator<unsigned_long>>::
    indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (*(View<float,true,std::allocator<unsigned_long>> **)this,*(size_t *)(this + 0x10),it)
    ;
    return;
  }
  lVar1 = *(long *)(this + 0x18);
  lVar2 = *(long *)(this + 0x20);
  for (lVar4 = 0; lVar2 - lVar1 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    it._M_current[lVar4] = *(unsigned_long *)(lVar1 + lVar4 * 8);
  }
  return;
}

Assistant:

inline void
Iterator<T, isConst, A>::coordinate
(
    CoordinateIterator it
) const
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index_ < view_->size());
    if(view_->isSimple()) {
        view_->indexToCoordinates(index_, it);
    }
    else {
        for(std::size_t j=0; j<coordinates_.size(); ++j, ++it) {
            *it = coordinates_[j];
        }
    }
}